

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

int __thiscall helics::CommonCore::generateMapObjectCounter(CommonCore *this)

{
  size_type sVar1;
  int iVar2;
  const_iterator __begin1;
  const_iterator __end1;
  const_iterator local_50;
  const_iterator local_38;
  
  iVar2 = (int)(this->super_BrokerBase).brokerState._M_i;
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::begin
            (&local_50,&(this->loopFederates).dataStorage);
  gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
            (&local_38,&(this->loopFederates).dataStorage);
  while ((local_50.offset != local_38.offset || (local_50.vec != local_38.vec))) {
    iVar2 = iVar2 + (uint)(local_50.ptr)->state;
    gmlc::containers::BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
    operator++(&local_50);
  }
  sVar1 = std::deque<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>::size
                    (&(this->loopHandles).handles);
  return (int)sVar1 + iVar2;
}

Assistant:

int CommonCore::generateMapObjectCounter() const
{
    int result = static_cast<int>(getBrokerState());
    for (const auto& fed : loopFederates) {
        result += static_cast<int>(fed.state);
    }
    result += static_cast<int>(loopHandles.size());
    return result;
}